

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcParser::add_nested_stm(CTcParser *this,CTPNStmTop *stm)

{
  CTPNStmTop *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x180) == 0) {
    *(CTPNStmTop **)(in_RDI + 0x178) = in_RSI;
  }
  else {
    CTPNStmTop::set_next_stm_top(*(CTPNStmTop **)(in_RDI + 0x180),in_RSI);
  }
  *(CTPNStmTop **)(in_RDI + 0x180) = in_RSI;
  return;
}

Assistant:

void CTcParser::add_nested_stm(CTPNStmTop *stm)
{
    /* link it into our list */
    if (nested_stm_tail_ != 0)
        nested_stm_tail_->set_next_stm_top(stm);
    else
        nested_stm_head_ = stm;
    nested_stm_tail_ = stm;
}